

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CupdlpWrapper.cpp
# Opt level: O2

void analysePdlpSolution(HighsOptions *options,HighsLp *lp,HighsSolution *highs_solution)

{
  vector<double,_std::allocator<double>_> *pvVar1;
  vector<double,_std::allocator<double>_> *pvVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  ulong uVar6;
  vector<double,_std::allocator<double>_> *pvVar7;
  char *pcVar8;
  vector<double,_std::allocator<double>_> *pvVar9;
  vector<double,_std::allocator<double>_> *pvVar10;
  vector<double,_std::allocator<double>_> *pvVar11;
  HighsInt iCol;
  ulong uVar12;
  HighsInt iCol_1;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  double dVar16;
  HighsInt num_dual_infeasibility;
  HighsInt num_primal_infeasibility;
  double dual;
  double value;
  double upper;
  double lower;
  double sum_dual_infeasibility;
  double sum_primal_infeasibility;
  double max_dual_infeasibility;
  double max_primal_infeasibility;
  double dual_feasibility_tolerance;
  double primal_feasibility_tolerance;
  anon_class_96_12_0262ff65 updateInfeasibilities;
  double local_110;
  uint local_108;
  uint local_104;
  double local_100;
  double local_f8;
  double local_f0;
  double local_e8;
  vector<double,_std::allocator<double>_> *local_e0;
  vector<double,_std::allocator<double>_> *local_d8;
  vector<double,_std::allocator<double>_> *local_d0;
  vector<double,_std::allocator<double>_> *local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  anon_class_96_12_0262ff65 local_90;
  
  pvVar1 = &highs_solution->col_value;
  for (uVar12 = 0; (long)uVar12 < (long)lp->num_col_; uVar12 = uVar12 + 1) {
    printf("x[%2d] = %11.5g\n",
           (pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start[uVar12],uVar12 & 0xffffffff);
  }
  pvVar2 = &highs_solution->row_dual;
  for (uVar12 = 0; (long)uVar12 < (long)lp->num_row_; uVar12 = uVar12 + 1) {
    printf("y[%2d] = %11.5g\n",
           (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start[uVar12],uVar12 & 0xffffffff);
  }
  local_90.num_primal_infeasibility = (HighsInt *)&local_104;
  local_104 = 0;
  local_90.num_dual_infeasibility = (HighsInt *)&local_108;
  local_108 = 0;
  local_90.max_primal_infeasibility = &local_a8;
  local_a8 = 0.0;
  local_90.max_dual_infeasibility = &local_b0;
  local_b0 = 0.0;
  local_90.sum_primal_infeasibility = &local_b8;
  local_b8 = 0.0;
  local_90.sum_dual_infeasibility = &local_c0;
  local_c0 = 0.0;
  local_98 = (options->super_HighsOptionsStruct).primal_feasibility_tolerance;
  local_90.primal_feasibility_tolerance = &local_98;
  local_a0 = (options->super_HighsOptionsStruct).dual_feasibility_tolerance;
  local_90.dual_feasibility_tolerance = &local_a0;
  local_90.value = &local_f8;
  local_90.lower = &local_e8;
  local_90.upper = &local_f0;
  local_90.dual = &local_100;
  local_c8 = &lp->col_lower_;
  local_d0 = &lp->col_upper_;
  for (lVar13 = 0; lVar13 < lp->num_col_; lVar13 = lVar13 + 1) {
    local_e8 = (lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar13];
    local_f0 = (lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar13];
    local_f8 = (pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start[lVar13];
    local_100 = (double)lp->sense_ *
                (highs_solution->col_dual).super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start[lVar13];
    analysePdlpSolution::anon_class_96_12_0262ff65::operator()(&local_90);
  }
  local_d8 = &lp->row_lower_;
  local_e0 = &lp->row_upper_;
  for (lVar13 = 0; uVar12 = (ulong)lp->num_row_, lVar13 < (long)uVar12; lVar13 = lVar13 + 1) {
    local_e8 = (lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar13];
    local_f0 = (lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar13];
    local_f8 = (highs_solution->row_value).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar13];
    local_100 = (double)lp->sense_ *
                (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start[lVar13];
    analysePdlpSolution::anon_class_96_12_0262ff65::operator()(&local_90);
  }
  local_110 = 0.0;
  uVar14 = 0;
  while( true ) {
    iVar5 = lp->num_col_;
    if ((long)(int)uVar12 + (long)iVar5 <= (long)uVar14) break;
    uVar12 = uVar14 & 0xffffffff;
    if ((long)uVar14 < (long)iVar5) {
      pcVar8 = "Column";
      uVar6 = uVar14;
      pvVar7 = pvVar1;
      pvVar9 = &highs_solution->col_dual;
      pvVar10 = local_c8;
      pvVar11 = local_d0;
    }
    else {
      uVar12 = (ulong)(uint)((int)uVar14 - iVar5);
      uVar6 = (ulong)((int)uVar14 - iVar5);
      pcVar8 = "Row   ";
      pvVar7 = &highs_solution->row_value;
      pvVar9 = pvVar2;
      pvVar10 = local_d8;
      pvVar11 = local_e0;
    }
    dVar16 = (pvVar7->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start[uVar6];
    dVar3 = (pvVar10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar6];
    dVar4 = (pvVar11->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar6];
    uVar15 = -(ulong)(dVar16 < (dVar3 + dVar4) * 0.5);
    dVar16 = ABS((pvVar9->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar6]) *
             ABS((double)(~uVar15 & (ulong)dVar4 | uVar15 & (ulong)dVar3) - dVar16);
    if (local_110 <= dVar16) {
      local_110 = dVar16;
    }
    printf("%s %2d [%11.5g, %11.5g, %11.5g] has (primal_residual, dual) values (%11.6g, %11.6g) so complementary_violation = %11.6g\n"
           ,pcVar8,uVar12);
    uVar14 = uVar14 + 1;
    uVar12 = (ulong)(uint)lp->num_row_;
  }
  printf("PDLP max complementary violation = %g\n",local_110);
  printf("     primal infeasibilities (%d, %11.6g, %11.6g)\n",local_b8,local_a8,(ulong)local_104);
  printf("     dual   infeasibilities (%d, %11.6g, %11.6g)\n",local_c0,local_b0,(ulong)local_108);
  return;
}

Assistant:

void analysePdlpSolution(const HighsOptions& options, const HighsLp& lp,
                         const HighsSolution& highs_solution) {
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++)
    printf("x[%2d] = %11.5g\n", int(iCol), highs_solution.col_value[iCol]);
  for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
    printf("y[%2d] = %11.5g\n", int(iRow), highs_solution.row_dual[iRow]);
  }

  HighsInt num_primal_infeasibility = 0;
  HighsInt num_dual_infeasibility = 0;
  double max_primal_infeasibility = 0;
  double max_dual_infeasibility = 0;
  double sum_primal_infeasibility = 0;
  double sum_dual_infeasibility = 0;
  const double primal_feasibility_tolerance =
      options.primal_feasibility_tolerance;
  const double dual_feasibility_tolerance = options.dual_feasibility_tolerance;
  double lower;
  double upper;
  double value;
  double dual;
  // lambda for computing infeasibilities
  auto updateInfeasibilities = [&]() {
    double primal_infeasibility = 0;
    double dual_infeasibility = 0;
    // @primal_infeasibility calculation
    if (value < lower - primal_feasibility_tolerance) {
      // Below lower
      primal_infeasibility = lower - value;
    } else if (value > upper + primal_feasibility_tolerance) {
      // Above upper
      primal_infeasibility = value - upper;
    }
    double value_residual =
        std::min(std::fabs(lower - value), std::fabs(value - upper));
    bool at_a_bound = value_residual <= primal_feasibility_tolerance;
    if (at_a_bound) {
      // At a bound
      double middle = (lower + upper) * 0.5;
      if (lower < upper) {
        // Non-fixed variable
        if (value < middle) {
          // At lower
          dual_infeasibility = std::max(-dual, 0.);
        } else {
          // At upper
          dual_infeasibility = std::max(dual, 0.);
        }
      } else {
        // Fixed variable
        dual_infeasibility = 0;
      }
    } else {
      // Off bounds (or free)
      dual_infeasibility = fabs(dual);
    }
    // Accumulate primal infeasibilities
    if (primal_infeasibility > primal_feasibility_tolerance)
      num_primal_infeasibility++;
    max_primal_infeasibility =
        std::max(primal_infeasibility, max_primal_infeasibility);
    sum_primal_infeasibility += primal_infeasibility;
    // Accumulate dual infeasibilities
    if (dual_infeasibility > dual_feasibility_tolerance)
      num_dual_infeasibility++;
    max_dual_infeasibility =
        std::max(dual_infeasibility, max_dual_infeasibility);
    sum_dual_infeasibility += dual_infeasibility;
  };

  // Apply the model sense, as PDLP will have done this
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    lower = lp.col_lower_[iCol];
    upper = lp.col_upper_[iCol];
    value = highs_solution.col_value[iCol];
    dual = int(lp.sense_) * highs_solution.col_dual[iCol];
    updateInfeasibilities();
  }
  for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
    lower = lp.row_lower_[iRow];
    upper = lp.row_upper_[iRow];
    value = highs_solution.row_value[iRow];
    dual = int(lp.sense_) * highs_solution.row_dual[iRow];
    updateInfeasibilities();
  }
  //
  // Determine the sum of complementary violations
  double max_complementary_violation = 0;
  for (HighsInt iVar = 0; iVar < lp.num_col_ + lp.num_row_; iVar++) {
    const bool is_col = iVar < lp.num_col_;
    const HighsInt iRow = iVar - lp.num_col_;
    const double primal = is_col ? highs_solution.col_value[iVar]
                                 : highs_solution.row_value[iRow];
    const double dual =
        is_col ? highs_solution.col_dual[iVar] : highs_solution.row_dual[iRow];
    const double lower = is_col ? lp.col_lower_[iVar] : lp.row_lower_[iRow];
    const double upper = is_col ? lp.col_upper_[iVar] : lp.row_upper_[iRow];
    const double mid = (lower + upper) * 0.5;
    const double primal_residual =
        primal < mid ? std::fabs(lower - primal) : std::fabs(upper - primal);
    const double dual_residual = std::fabs(dual);
    const double complementary_violation = primal_residual * dual_residual;
    max_complementary_violation =
        std::max(complementary_violation, max_complementary_violation);
    printf(
        "%s %2d [%11.5g, %11.5g, %11.5g] has (primal_residual, dual) values "
        "(%11.6g, %11.6g) so complementary_violation = %11.6g\n",
        is_col ? "Column" : "Row   ", is_col ? int(iVar) : int(iRow), lower,
        primal, upper, primal_residual, dual_residual, complementary_violation);
  }
  printf("PDLP max complementary violation = %g\n",
         max_complementary_violation);
  printf("     primal infeasibilities (%d, %11.6g, %11.6g)\n",
         int(num_primal_infeasibility), sum_primal_infeasibility,
         max_primal_infeasibility);
  printf("     dual   infeasibilities (%d, %11.6g, %11.6g)\n",
         int(num_dual_infeasibility), sum_dual_infeasibility,
         max_dual_infeasibility);
}